

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrentupdate.cpp
# Opt level: O0

void test_concurrent_update::read_total_balance(DuckDB *db,bool *read_correct)

{
  initializer_list<duckdb::Value> iVar1;
  bool bVar2;
  byte bVar3;
  undefined1 *in_RSI;
  DuckDB *in_RDI;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  result;
  Connection con;
  allocator_type *in_stack_fffffffffffffeb8;
  vector<duckdb::Value,_true> *in_stack_fffffffffffffec0;
  iterator in_stack_fffffffffffffec8;
  size_type in_stack_fffffffffffffed0;
  Value *local_108;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined1 *column_number;
  allocator *result_00;
  undefined1 local_e1;
  Value *local_e0;
  Value local_d8 [64];
  Value *local_98;
  undefined8 local_90;
  allocator local_59;
  string local_58 [32];
  string local_38 [8];
  Connection local_30 [32];
  undefined1 *local_10;
  
  *in_RSI = 1;
  local_10 = in_RSI;
  duckdb::Connection::Connection(local_30,in_RDI);
  while (bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffec8),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    result_00 = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"SELECT SUM(money) FROM accounts",result_00);
    duckdb::Connection::Query(local_38);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    local_e0 = local_d8;
    duckdb::Value::Value(local_e0,100);
    local_98 = local_d8;
    local_90 = 1;
    column_number = &local_e1;
    std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x7883b2);
    iVar1._M_len = in_stack_fffffffffffffed0;
    iVar1._M_array = in_stack_fffffffffffffec8;
    duckdb::vector<duckdb::Value,_true>::vector
              (in_stack_fffffffffffffec0,iVar1,in_stack_fffffffffffffeb8);
    in_stack_ffffffffffffff07 =
         duckdb::CHECK_COLUMN
                   ((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                     *)result_00,(size_t)column_number,
                    (vector<duckdb::Value,_true> *)
                    CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    bVar3 = in_stack_ffffffffffffff07 ^ 0xff;
    duckdb::vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x78840c);
    std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x788416);
    local_108 = (Value *)&local_98;
    do {
      local_108 = local_108 + -0x40;
      duckdb::Value::~Value(local_108);
    } while (local_108 != local_d8);
    if ((bVar3 & 1) != 0) {
      *local_10 = 0;
    }
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x788592);
  }
  duckdb::Connection::~Connection(local_30);
  return;
}

Assistant:

static void read_total_balance(DuckDB *db, bool *read_correct) {
	*read_correct = true;
	Connection con(*db);
	while (!finished_updating) {
		// the total balance should remain constant regardless of updates
		auto result = con.Query("SELECT SUM(money) FROM accounts");
		if (!CHECK_COLUMN(result, 0, {CONCURRENT_UPDATE_TOTAL_ACCOUNTS * CONCURRENT_UPDATE_MONEY_PER_ACCOUNT})) {
			*read_correct = false;
		}
	}
}